

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O2

int KINSetLinearSolver(void *kinmem,SUNLinearSolver LS,SUNMatrix A)

{
  long lVar1;
  SUNLinearSolver_Type SVar2;
  int iVar3;
  uint *__ptr;
  _generic_SUNLinearSolver_Ops *p_Var4;
  code *pcVar5;
  void *pvVar6;
  char *pcVar7;
  
  if (kinmem == (void *)0x0) {
    pcVar7 = "KINSOL memory is NULL.";
    iVar3 = -1;
  }
  else {
    if (LS != (SUNLinearSolver)0x0) {
      p_Var4 = LS->ops;
      if ((((p_Var4->gettype == (_func_SUNLinearSolver_Type_SUNLinearSolver *)0x0) ||
           (p_Var4->initialize == (_func_int_SUNLinearSolver *)0x0)) ||
          (p_Var4->setup == (_func_int_SUNLinearSolver_SUNMatrix *)0x0)) ||
         (p_Var4->solve == (_func_int_SUNLinearSolver_SUNMatrix_N_Vector_N_Vector_realtype *)0x0)) {
        pcVar7 = "LS object is missing a required operation";
      }
      else {
        lVar1 = *(long *)(*(long *)((long)kinmem + 0x140) + 8);
        if ((*(long *)(lVar1 + 0x40) == 0) || (*(long *)(lVar1 + 0x78) == 0)) {
          pcVar7 = "A required vector operation is not implemented.";
        }
        else {
          SVar2 = SUNLinSolGetType(LS);
          if (SVar2 == SUNLINEARSOLVER_ITERATIVE) {
            if (LS->ops->setatimes != (_func_int_SUNLinearSolver_void_ptr_ATimesFn *)0x0) {
LAB_0010de89:
              if (*(code **)((long)kinmem + 0x1e8) != (code *)0x0) {
                (**(code **)((long)kinmem + 0x1e8))(kinmem);
              }
              *(uint *)((long)kinmem + 0x1f0) = (uint)(SVar2 - SUNLINEARSOLVER_ITERATIVE < 2);
              *(code **)((long)kinmem + 0x1d0) = kinLsInitialize;
              *(code **)((long)kinmem + 0x1d8) = kinLsSetup;
              *(code **)((long)kinmem + 0x1e0) = kinLsSolve;
              *(code **)((long)kinmem + 0x1e8) = kinLsFree;
              __ptr = (uint *)calloc(1,0xb0);
              if (__ptr != (uint *)0x0) {
                *(SUNLinearSolver *)(__ptr + 6) = LS;
                pcVar5 = (code *)0x0;
                pvVar6 = (void *)0x0;
                if (A != (SUNMatrix)0x0) {
                  pcVar5 = kinLsDQJac;
                  pvVar6 = kinmem;
                }
                *__ptr = A == (SUNMatrix)0x0 ^ 1;
                *(code **)(__ptr + 2) = pcVar5;
                *(void **)(__ptr + 4) = pvVar6;
                __ptr[0x26] = 1;
                *(code **)(__ptr + 0x28) = kinLsDQJtimes;
                *(void **)(__ptr + 0x2a) = kinmem;
                __ptr[0x22] = 0;
                __ptr[0x23] = 0;
                __ptr[0x1e] = 0;
                __ptr[0x1f] = 0;
                __ptr[0x20] = 0;
                __ptr[0x21] = 0;
                *(undefined8 *)(__ptr + 0x24) = *(undefined8 *)((long)kinmem + 0x10);
                __ptr[0xc] = 0;
                __ptr[0xd] = 0;
                __ptr[0xe] = 0;
                __ptr[0xf] = 0;
                __ptr[0x10] = 0;
                __ptr[0x11] = 0;
                __ptr[0x12] = 0;
                __ptr[0x13] = 0;
                __ptr[0x18] = 0;
                __ptr[0x19] = 0;
                __ptr[0x14] = 0;
                __ptr[0x15] = 0;
                __ptr[0x16] = 0;
                __ptr[0x17] = 0;
                __ptr[0x1c] = 0;
                __ptr[0x1d] = 0;
                p_Var4 = LS->ops;
                if (p_Var4->setatimes != (_func_int_SUNLinearSolver_void_ptr_ATimesFn *)0x0) {
                  iVar3 = SUNLinSolSetATimes(LS,kinmem,kinLsATimes);
                  if (iVar3 != 0) {
                    pcVar7 = "Error in calling SUNLinSolSetATimes";
                    goto LAB_0010e02f;
                  }
                  p_Var4 = LS->ops;
                }
                if ((p_Var4->setpreconditioner ==
                     (_func_int_SUNLinearSolver_void_ptr_PSetupFn_PSolveFn *)0x0) ||
                   (iVar3 = SUNLinSolSetPreconditioner(LS,kinmem,(PSetupFn)0x0,(PSolveFn)0x0),
                   iVar3 == 0)) {
                  __ptr[10] = 0;
                  __ptr[0xb] = 0xbff00000;
                  *(SUNMatrix *)(__ptr + 8) = A;
                  *(uint **)((long)kinmem + 0x1f8) = __ptr;
                  return 0;
                }
                pcVar7 = "Error in calling SUNLinSolSetPreconditioner";
LAB_0010e02f:
                KINProcessError((KINMem)kinmem,-8,"KINLS","KINSetLinearSolver",pcVar7);
                free(__ptr);
                return -8;
              }
              pcVar7 = "A memory request failed.";
              iVar3 = -4;
              goto LAB_0010de04;
            }
            pcVar7 = "Incompatible inputs: iterative LS must support ATimes routine";
          }
          else if (A == (SUNMatrix)0x0 && SVar2 == SUNLINEARSOLVER_DIRECT) {
            pcVar7 = "Incompatible inputs: direct LS requires non-NULL matrix";
          }
          else {
            if (SVar2 != SUNLINEARSOLVER_MATRIX_ITERATIVE || A != (SUNMatrix)0x0) goto LAB_0010de89;
            pcVar7 = "Incompatible inputs: matrix-iterative LS requires non-NULL matrix";
          }
        }
      }
      iVar3 = -3;
      goto LAB_0010de04;
    }
    pcVar7 = "LS must be non-NULL";
    iVar3 = -3;
  }
  kinmem = (KINMem)0x0;
LAB_0010de04:
  KINProcessError((KINMem)kinmem,iVar3,"KINLS","KINSetLinearSolver",pcVar7);
  return iVar3;
}

Assistant:

int KINSetLinearSolver(void *kinmem, SUNLinearSolver LS, SUNMatrix A)
{
  KINMem   kin_mem;
  KINLsMem kinls_mem;
  int      retval, LSType;

  /* Return immediately if either kinmem or LS inputs are NULL */
  if (kinmem == NULL) {
    KINProcessError(NULL, KINLS_MEM_NULL, "KINLS",
                    "KINSetLinearSolver", MSG_LS_KINMEM_NULL);
    return(KINLS_MEM_NULL);
  }
  if (LS == NULL) {
    KINProcessError(NULL, KINLS_ILL_INPUT, "KINLS",
                    "KINSetLinearSolver",
                    "LS must be non-NULL");
    return(KINLS_ILL_INPUT);
  }
  kin_mem = (KINMem) kinmem;

  /* Test if solver is compatible with LS interface */
  if ( (LS->ops->gettype == NULL) ||
       (LS->ops->initialize == NULL) ||
       (LS->ops->setup == NULL) ||
       (LS->ops->solve == NULL) ) {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, "KINLS",
                   "KINSetLinearSolver",
                   "LS object is missing a required operation");
    return(KINLS_ILL_INPUT);
  }

  /* check for required vector operations for KINLS interface */
  if ( (kin_mem->kin_vtemp1->ops->nvconst == NULL) ||
       (kin_mem->kin_vtemp1->ops->nvdotprod == NULL) ) {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, "KINLS",
                    "KINSetLinearSolver", MSG_LS_BAD_NVECTOR);
    return(KINLS_ILL_INPUT);
  }

  /* Retrieve the LS type */
  LSType = SUNLinSolGetType(LS);

  /* Check for compatible LS type, matrix and "atimes" support */
  if ((LSType == SUNLINEARSOLVER_ITERATIVE) && (LS->ops->setatimes == NULL)) {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, "KINLS", "KINSetLinearSolver",
                    "Incompatible inputs: iterative LS must support ATimes routine");
    return(KINLS_ILL_INPUT);
  }
  if ((LSType == SUNLINEARSOLVER_DIRECT) && (A == NULL)) {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, "KINLS", "KINSetLinearSolver",
                    "Incompatible inputs: direct LS requires non-NULL matrix");
    return(KINLS_ILL_INPUT);
  }
  if ((LSType == SUNLINEARSOLVER_MATRIX_ITERATIVE) && (A == NULL)) {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, "KINLS", "KINSetLinearSolver",
                    "Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
    return(KINLS_ILL_INPUT);
  }

  /* free any existing system solver attached to KIN */
  if (kin_mem->kin_lfree) kin_mem->kin_lfree(kin_mem);

  /* Determine if this is an iterative linear solver */
  kin_mem->kin_inexact_ls = ( (LSType == SUNLINEARSOLVER_ITERATIVE) ||
                              (LSType == SUNLINEARSOLVER_MATRIX_ITERATIVE) );

  /* Set four main system linear solver function fields in kin_mem */
  kin_mem->kin_linit  = kinLsInitialize;
  kin_mem->kin_lsetup = kinLsSetup;
  kin_mem->kin_lsolve = kinLsSolve;
  kin_mem->kin_lfree  = kinLsFree;

  /* Get memory for KINLsMemRec */
  kinls_mem = NULL;
  kinls_mem = (KINLsMem) malloc(sizeof(struct KINLsMemRec));
  if (kinls_mem == NULL) {
    KINProcessError(kin_mem, KINLS_MEM_FAIL, "KINLS",
                    "KINSetLinearSolver", MSG_LS_MEM_FAIL);
    return(KINLS_MEM_FAIL);
  }
  memset(kinls_mem, 0, sizeof(struct KINLsMemRec));

  /* set SUNLinearSolver pointer */
  kinls_mem->LS = LS;

  /* Set defaults for Jacobian-related fields */
  if (A != NULL) {
    kinls_mem->jacDQ  = SUNTRUE;
    kinls_mem->jac    = kinLsDQJac;
    kinls_mem->J_data = kin_mem;
  } else {
    kinls_mem->jacDQ  = SUNFALSE;
    kinls_mem->jac    = NULL;
    kinls_mem->J_data = NULL;
  }
  kinls_mem->jtimesDQ = SUNTRUE;
  kinls_mem->jtimes   = kinLsDQJtimes;
  kinls_mem->jt_data  = kin_mem;

  /* Set defaults for preconditioner-related fields */
  kinls_mem->pset   = NULL;
  kinls_mem->psolve = NULL;
  kinls_mem->pfree  = NULL;
  kinls_mem->pdata  = kin_mem->kin_user_data;

  /* Initialize counters */
  kinLsInitializeCounters(kinls_mem);

  /* Set default values for the rest of the LS parameters */
  kinls_mem->last_flag = KINLS_SUCCESS;

  /* If LS supports ATimes, attach KINLs routine */
  if (LS->ops->setatimes) {
    retval = SUNLinSolSetATimes(LS, kin_mem, kinLsATimes);
    if (retval != SUNLS_SUCCESS) {
      KINProcessError(kin_mem, KINLS_SUNLS_FAIL, "KINLS",
                      "KINSetLinearSolver",
                      "Error in calling SUNLinSolSetATimes");
      free(kinls_mem); kinls_mem = NULL;
      return(KINLS_SUNLS_FAIL);
    }
  }

  /* If LS supports preconditioning, initialize pset/psol to NULL */
  if (LS->ops->setpreconditioner) {
    retval = SUNLinSolSetPreconditioner(LS, kin_mem, NULL, NULL);
    if (retval != SUNLS_SUCCESS) {
      KINProcessError(kin_mem, KINLS_SUNLS_FAIL, "KINLS",
                      "KINSetLinearSolver",
                      "Error in calling SUNLinSolSetPreconditioner");
      free(kinls_mem); kinls_mem = NULL;
      return(KINLS_SUNLS_FAIL);
    }
  }

  /* initialize tolerance scaling factor */
  kinls_mem->tol_fac = -ONE;

  /* set SUNMatrix pointer (can be NULL) */
  kinls_mem->J = A;

  /* Attach linear solver memory to integrator memory */
  kin_mem->kin_lmem = kinls_mem;

  return(KINLS_SUCCESS);
}